

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  anon_struct_32_2_94737341 t;
  uint32_t *RK;
  int i;
  uint32_t r_3;
  uint32_t r_2;
  uint32_t r_1;
  uint32_t r;
  uint *local_a8;
  int local_9c;
  
  puVar8 = (uint *)(in_RDI + *(long *)(in_RDI + 2) + 4);
  uVar1 = *puVar8 ^ *in_RSI;
  uVar2 = puVar8[1] ^ in_RSI[1];
  uVar3 = puVar8[2] ^ in_RSI[2];
  local_a8 = puVar8 + 4;
  uVar4 = puVar8[3] ^ in_RSI[3];
  local_9c = *in_RDI >> 1;
  while (local_9c = local_9c + -1, 0 < local_9c) {
    uVar5 = *local_a8 ^ RT0[uVar1 & 0xff] ^ RT1[uVar4 >> 8 & 0xff] ^ RT2[uVar3 >> 0x10 & 0xff] ^
            RT3[uVar2 >> 0x18];
    uVar6 = local_a8[1] ^ RT0[uVar2 & 0xff] ^ RT1[uVar1 >> 8 & 0xff] ^ RT2[uVar4 >> 0x10 & 0xff] ^
            RT3[uVar3 >> 0x18];
    uVar7 = local_a8[2] ^ RT0[uVar3 & 0xff] ^ RT1[uVar2 >> 8 & 0xff] ^ RT2[uVar1 >> 0x10 & 0xff] ^
            RT3[uVar4 >> 0x18];
    uVar4 = local_a8[3] ^ RT0[uVar4 & 0xff] ^ RT1[uVar3 >> 8 & 0xff] ^ RT2[uVar2 >> 0x10 & 0xff] ^
            RT3[uVar1 >> 0x18];
    uVar1 = local_a8[4] ^ RT0[uVar5 & 0xff] ^ RT1[uVar4 >> 8 & 0xff] ^ RT2[uVar7 >> 0x10 & 0xff] ^
            RT3[uVar6 >> 0x18];
    uVar2 = local_a8[5] ^ RT0[uVar6 & 0xff] ^ RT1[uVar5 >> 8 & 0xff] ^ RT2[uVar4 >> 0x10 & 0xff] ^
            RT3[uVar7 >> 0x18];
    puVar8 = local_a8 + 7;
    uVar3 = local_a8[6] ^ RT0[uVar7 & 0xff] ^ RT1[uVar6 >> 8 & 0xff] ^ RT2[uVar5 >> 0x10 & 0xff] ^
            RT3[uVar4 >> 0x18];
    local_a8 = local_a8 + 8;
    uVar4 = *puVar8 ^ RT0[uVar4 & 0xff] ^ RT1[uVar7 >> 8 & 0xff] ^ RT2[uVar6 >> 0x10 & 0xff] ^
            RT3[uVar5 >> 0x18];
  }
  uVar5 = *local_a8 ^ RT0[uVar1 & 0xff] ^ RT1[uVar4 >> 8 & 0xff] ^ RT2[uVar3 >> 0x10 & 0xff] ^
          RT3[uVar2 >> 0x18];
  uVar6 = local_a8[1] ^ RT0[uVar2 & 0xff] ^ RT1[uVar1 >> 8 & 0xff] ^ RT2[uVar4 >> 0x10 & 0xff] ^
          RT3[uVar3 >> 0x18];
  uVar7 = local_a8[2] ^ RT0[uVar3 & 0xff] ^ RT1[uVar2 >> 8 & 0xff] ^ RT2[uVar1 >> 0x10 & 0xff] ^
          RT3[uVar4 >> 0x18];
  uVar1 = local_a8[3] ^ RT0[uVar4 & 0xff] ^ RT1[uVar3 >> 8 & 0xff] ^ RT2[uVar2 >> 0x10 & 0xff] ^
          RT3[uVar1 >> 0x18];
  uVar2 = local_a8[4] ^ (uint)RSb[uVar5 & 0xff] ^ (uint)RSb[uVar1 >> 8 & 0xff] << 8 ^
          (uint)RSb[uVar7 >> 0x10 & 0xff] << 0x10 ^ (uint)RSb[uVar6 >> 0x18] << 0x18;
  uVar3 = local_a8[5] ^ (uint)RSb[uVar6 & 0xff] ^ (uint)RSb[uVar5 >> 8 & 0xff] << 8 ^
          (uint)RSb[uVar1 >> 0x10 & 0xff] << 0x10 ^ (uint)RSb[uVar7 >> 0x18] << 0x18;
  uVar4 = local_a8[6] ^ (uint)RSb[uVar7 & 0xff] ^ (uint)RSb[uVar6 >> 8 & 0xff] << 8 ^
          (uint)RSb[uVar5 >> 0x10 & 0xff] << 0x10 ^ (uint)RSb[uVar1 >> 0x18] << 0x18;
  uVar1 = local_a8[7] ^ (uint)RSb[uVar1 & 0xff] ^ (uint)RSb[uVar7 >> 8 & 0xff] << 8 ^
          (uint)RSb[uVar6 >> 0x10 & 0xff] << 0x10 ^ (uint)RSb[uVar5 >> 0x18] << 0x18;
  *in_RDX = uVar2;
  in_RDX[1] = uVar3;
  in_RDX[2] = uVar4;
  in_RDX[3] = uVar1;
  mbedtls_platform_zeroize((void *)CONCAT44(uVar1,uVar4),CONCAT44(uVar3,uVar2));
  return 0;
}

Assistant:

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,
                                 const unsigned char input[16],
                                 unsigned char output[16])
{
    int i;
    uint32_t *RK = ctx->buf + ctx->rk_offset;
    struct {
        uint32_t X[4];
        uint32_t Y[4];
    } t;

    t.X[0] = MBEDTLS_GET_UINT32_LE(input,  0); t.X[0] ^= *RK++;
    t.X[1] = MBEDTLS_GET_UINT32_LE(input,  4); t.X[1] ^= *RK++;
    t.X[2] = MBEDTLS_GET_UINT32_LE(input,  8); t.X[2] ^= *RK++;
    t.X[3] = MBEDTLS_GET_UINT32_LE(input, 12); t.X[3] ^= *RK++;

    for (i = (ctx->nr >> 1) - 1; i > 0; i--) {
        AES_RROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);
        AES_RROUND(t.X[0], t.X[1], t.X[2], t.X[3], t.Y[0], t.Y[1], t.Y[2], t.Y[3]);
    }

    AES_RROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);

    t.X[0] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[0])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[3])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[2])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[1])] << 24);

    t.X[1] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[1])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[0])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[3])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[2])] << 24);

    t.X[2] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[2])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[1])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[0])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[3])] << 24);

    t.X[3] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[3])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[2])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[1])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[0])] << 24);

    MBEDTLS_PUT_UINT32_LE(t.X[0], output,  0);
    MBEDTLS_PUT_UINT32_LE(t.X[1], output,  4);
    MBEDTLS_PUT_UINT32_LE(t.X[2], output,  8);
    MBEDTLS_PUT_UINT32_LE(t.X[3], output, 12);

    mbedtls_platform_zeroize(&t, sizeof(t));

    return 0;
}